

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O0

void __thiscall JSONHandler::handle(JSONHandler *this,string *path,JSON *j)

{
  JSON *pJVar1;
  JSON *__args;
  bool bVar2;
  function *this_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  *this_01;
  pointer pMVar3;
  element_type *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  JSON local_130;
  anon_class_24_3_c839da0b local_120;
  function<void_(JSON)> local_108;
  size_t local_e8;
  size_t i;
  anon_class_24_3_449d2a6d local_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  local_b8;
  undefined1 local_98 [8];
  string path_base;
  undefined1 local_60 [8];
  string s_value;
  bool bvalue;
  JSON local_30;
  JSON *local_20;
  JSON *j_local;
  string *path_local;
  JSONHandler *this_local;
  
  local_20 = j;
  j_local = (JSON *)path;
  path_local = (string *)this;
  this_00 = (function *)
            std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
            operator->(&this->m);
  bVar2 = std::function::operator_cast_to_bool(this_00);
  if (bVar2) {
    this_01 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
               *)std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
                 operator->(&this->m);
    pJVar1 = j_local;
    JSON::JSON(&local_30,j);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
    ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pJVar1
                 ,&local_30);
    JSON::~JSON(&local_30);
  }
  else {
    s_value.field_2._M_local_buf[0xb] = '\0';
    std::__cxx11::string::string((string *)local_60);
    pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
             operator->(&this->m);
    bVar2 = std::function::operator_cast_to_bool((function *)&(pMVar3->h).null_handler);
    if ((bVar2) && (bVar2 = JSON::isNull(j), bVar2)) {
      pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
               operator->(&this->m);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&(pMVar3->h).null_handler,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)j_local);
    }
    else {
      pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
               operator->(&this->m);
      bVar2 = std::function::operator_cast_to_bool((function *)&(pMVar3->h).string_handler);
      if ((bVar2) && (bVar2 = JSON::getString(j,(string *)local_60), bVar2)) {
        pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
                 operator->(&this->m);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&(pMVar3->h).string_handler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)j_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      }
      else {
        pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
                 operator->(&this->m);
        bVar2 = std::function::operator_cast_to_bool((function *)&(pMVar3->h).number_handler);
        if ((bVar2) && (bVar2 = JSON::getNumber(j,(string *)local_60), bVar2)) {
          pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                   ::operator->(&this->m);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(&(pMVar3->h).number_handler,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)j_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
        }
        else {
          pMVar3 = std::unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                   ::operator->(&this->m);
          bVar2 = std::function::operator_cast_to_bool((function *)&(pMVar3->h).bool_handler);
          if ((bVar2) &&
             (bVar2 = JSON::getBool(j,(bool *)(s_value.field_2._M_local_buf + 0xb)), bVar2)) {
            pMVar3 = std::
                     unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
                     operator->(&this->m);
            std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::operator()(&(pMVar3->h).bool_handler,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         j_local,(bool)(s_value.field_2._M_local_buf[0xb] & 1));
          }
          else {
            pMVar3 = std::
                     unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>::
                     operator->(&this->m);
            bVar2 = std::function::operator_cast_to_bool
                              ((function *)&(pMVar3->h).dict_start_handler);
            if ((bVar2) && (bVar2 = JSON::isDictionary(j), bVar2)) {
              pMVar3 = std::
                       unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                       ::operator->(&this->m);
              __args = j_local;
              pJVar1 = (JSON *)((long)&path_base.field_2 + 8);
              JSON::JSON(pJVar1,j);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
              ::operator()(&(pMVar3->h).dict_start_handler,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __args,pJVar1);
              JSON::~JSON((JSON *)((long)&path_base.field_2 + 8));
              std::__cxx11::string::string((string *)local_98,(string *)j_local);
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98,".");
              if (bVar2) {
                std::__cxx11::string::operator+=((string *)local_98,".");
              }
              local_d0.path = (string *)j_local;
              local_d0.path_base = (string *)local_98;
              local_d0.this = this;
              std::function<void(std::__cxx11::string_const&,JSON)>::
              function<JSONHandler::handle(std::__cxx11::string_const&,JSON)::__0,void>
                        ((function<void(std::__cxx11::string_const&,JSON)> *)&local_b8,&local_d0);
              JSON::forEachDictItem(j,&local_b8);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
              ::~function(&local_b8);
              pMVar3 = std::
                       unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                       ::operator->(&this->m);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(&(pMVar3->h).dict_end_handler,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           j_local);
              std::__cxx11::string::~string((string *)local_98);
            }
            else {
              pMVar3 = std::
                       unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                       ::operator->(&this->m);
              bVar2 = std::function::operator_cast_to_bool
                                ((function *)&(pMVar3->h).array_start_handler);
              if ((bVar2) && (bVar2 = JSON::isArray(j), bVar2)) {
                pMVar3 = std::
                         unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                         ::operator->(&this->m);
                pJVar1 = j_local;
                JSON::JSON((JSON *)&i,j);
                std::
                function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                ::operator()(&(pMVar3->h).array_start_handler,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pJVar1,(JSON *)&i);
                JSON::~JSON((JSON *)&i);
                local_e8 = 0;
                local_120.i = &local_e8;
                local_120.path = (string *)j_local;
                local_120.this = this;
                std::function<void(JSON)>::
                function<JSONHandler::handle(std::__cxx11::string_const&,JSON)::__1,void>
                          ((function<void(JSON)> *)&local_108,&local_120);
                JSON::forEachArrayItem(j,&local_108);
                std::function<void_(JSON)>::~function(&local_108);
                pMVar3 = std::
                         unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                         ::operator->(&this->m);
                std::
                function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()(&(pMVar3->h).array_end_handler,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             j_local);
              }
              else {
                pMVar3 = std::
                         unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                         ::operator->(&this->m);
                bVar2 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr *)&(pMVar3->h).fallback_handler);
                if (bVar2) {
                  pMVar3 = std::
                           unique_ptr<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                           ::operator->(&this->m);
                  this_02 = std::
                            __shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&(pMVar3->h).fallback_handler);
                  pJVar1 = j_local;
                  JSON::JSON(&local_130,j);
                  handle(this_02,(string *)pJVar1,&local_130);
                  JSON::~JSON(&local_130);
                }
                else {
                  QTC::TC("libtests","JSONHandler unhandled value",0);
                  std::operator+(&local_170,"JSON handler: value at ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)j_local);
                  std::operator+(&local_150,&local_170," is not of expected type");
                  usage(&local_150);
                  std::__cxx11::string::~string((string *)&local_150);
                  std::__cxx11::string::~string((string *)&local_170);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void
JSONHandler::handle(std::string const& path, JSON j)
{
    if (m->h.any_handler) {
        m->h.any_handler(path, j);
        return;
    }

    bool bvalue = false;
    std::string s_value;
    if (m->h.null_handler && j.isNull()) {
        m->h.null_handler(path);
        return;
    }
    if (m->h.string_handler && j.getString(s_value)) {
        m->h.string_handler(path, s_value);
        return;
    }
    if (m->h.number_handler && j.getNumber(s_value)) {
        m->h.number_handler(path, s_value);
        return;
    }
    if (m->h.bool_handler && j.getBool(bvalue)) {
        m->h.bool_handler(path, bvalue);
        return;
    }
    if (m->h.dict_start_handler && j.isDictionary()) {
        m->h.dict_start_handler(path, j);
        std::string path_base = path;
        if (path_base != ".") {
            path_base += ".";
        }
        j.forEachDictItem([&path, &path_base, this](std::string const& k, JSON v) {
            auto i = m->h.dict_handlers.find(k);
            if (i == m->h.dict_handlers.end()) {
                if (m->h.fallback_dict_handler.get()) {
                    m->h.fallback_dict_handler->handle(path_base + k, v);
                } else {
                    QTC::TC("libtests", "JSONHandler unexpected key");
                    usage("JSON handler found unexpected key " + k + " in object at " + path);
                }
            } else {
                i->second->handle(path_base + k, v);
            }
        });
        m->h.dict_end_handler(path);
        return;
    }
    if (m->h.array_start_handler && j.isArray()) {
        m->h.array_start_handler(path, j);
        size_t i = 0;
        j.forEachArrayItem([&i, &path, this](JSON v) {
            m->h.array_item_handler->handle(path + "[" + std::to_string(i) + "]", v);
            ++i;
        });
        m->h.array_end_handler(path);
        return;
    }

    if (m->h.fallback_handler) {
        m->h.fallback_handler->handle(path, j);
        return;
    }

    // It would be nice to include information about what type the object was and what types were
    // allowed, but we're relying on schema validation to make sure input is properly structured
    // before calling the handlers. It would be different if this code were trying to be part of a
    // general-purpose JSON package.
    QTC::TC("libtests", "JSONHandler unhandled value");
    usage("JSON handler: value at " + path + " is not of expected type");
}